

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Mode __thiscall
Catch::Clara::Parser::handleOpt
          (Parser *this,size_t i,char c,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  long lVar1;
  undefined7 in_register_00000011;
  ulong uVar2;
  string optName;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  undefined4 local_90 [2];
  char local_88 [16];
  string *local_78;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  local_90[0] = 0x3d3a;
  local_98._M_p = (char *)0x3;
  local_a0 = (undefined1  [8])local_90;
  local_78 = arg;
  lVar1 = std::__cxx11::string::find((char)local_a0,CONCAT71(in_register_00000011,c) & 0xffffffff);
  if (local_a0 != (undefined1  [8])local_90) {
    operator_delete((void *)local_a0);
  }
  if (lVar1 == -1) {
    return this->mode;
  }
  std::__cxx11::string::substr((ulong)&local_50,(ulong)local_78);
  if (this->mode == SlashOpt) {
    if (local_48 != 1) goto LAB_0012f072;
    local_a0._0_4_ = 1;
    local_98._M_p = local_88;
    std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_50,local_50 + 1);
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
    emplace_back<Catch::Clara::Parser::Token>(tokens,(Token *)local_a0);
  }
  else {
    if (this->mode == ShortOpt) {
      if (local_48 != 0) {
        uVar2 = 0;
        do {
          std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_50);
          local_a0._0_4_ = 1;
          local_98._M_p = local_88;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,local_70,local_70 + local_68);
          std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
          emplace_back<Catch::Clara::Parser::Token>(tokens,(Token *)local_a0);
          if (local_98._M_p != local_88) {
            operator_delete(local_98._M_p);
          }
          if (local_70 != local_60) {
            operator_delete(local_70);
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 < local_48);
      }
      goto LAB_0012f0b0;
    }
LAB_0012f072:
    local_a0._0_4_ = 2;
    local_98._M_p = local_88;
    std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_50,local_50 + local_48);
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
    emplace_back<Catch::Clara::Parser::Token>(tokens,(Token *)local_a0);
  }
  if (local_98._M_p != local_88) {
    operator_delete(local_98._M_p);
  }
LAB_0012f0b0:
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return None;
}

Assistant:

Mode handleOpt( std::size_t i, char c, std::string const& arg, std::vector<Token>& tokens ) {
            if( std::string( ":=\0", 3 ).find( c ) == std::string::npos )
                return mode;

            std::string optName = arg.substr( from, i-from );
            if( mode == ShortOpt )
                for( std::size_t j = 0; j < optName.size(); ++j )
                    tokens.push_back( Token( Token::ShortOpt, optName.substr( j, 1 ) ) );
            else if( mode == SlashOpt && optName.size() == 1 )
                tokens.push_back( Token( Token::ShortOpt, optName ) );
            else
                tokens.push_back( Token( Token::LongOpt, optName ) );
            return None;
        }